

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.hpp
# Opt level: O2

size_t JEBDebug::internal::print_characters
                 (ostream *stream,void *data,size_t num_bytes,size_t num_chars)

{
  size_t sVar1;
  long lVar2;
  bool bVar3;
  
  if (num_chars < num_bytes) {
    num_bytes = num_chars;
  }
  for (sVar1 = 0; num_bytes != sVar1; sVar1 = sVar1 + 1) {
    std::ostream::put((char)stream);
  }
  lVar2 = num_chars + num_bytes * -2 + sVar1;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    std::ostream::put((char)stream);
  }
  return num_bytes;
}

Assistant:

inline size_t print_characters(std::ostream& stream,
                                       const void* data, size_t num_bytes,
                                       size_t num_chars)
        {
            size_t i = 0;
            auto n = std::min(num_bytes, num_chars);
            const auto* cdata = static_cast<const unsigned char*>(data);
            for (; i < n; ++i)
            {
                if (32 <= cdata[i] && cdata[i] < 127)
                    stream.put(char(cdata[i]));
                else
                    stream.put('.');
            }
            for (; i < num_chars; ++i)
                stream.put(' ');
            return n;
        }